

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::RegrSState,double,double,duckdb::RegrSXXOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,RegrSState **states,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *ssel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  double dVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  RegrSState *pRVar6;
  sel_t *psVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  uint64_t uVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0 && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = bsel->sel_vector;
      psVar5 = ssel->sel_vector;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (psVar4 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar4[iVar9];
        }
        iVar11 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar5[iVar9];
        }
        pRVar6 = states[iVar11];
        uVar18 = (pRVar6->var_pop).count + 1;
        pRVar6->count = pRVar6->count + 1;
        (pRVar6->var_pop).count = uVar18;
        dVar1 = bdata[iVar10];
        dVar15 = (pRVar6->var_pop).mean;
        dVar19 = dVar1 - dVar15;
        auVar16._8_4_ = (int)(uVar18 >> 0x20);
        auVar16._0_8_ = uVar18;
        auVar16._12_4_ = 0x45300000;
        dVar15 = dVar19 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) + dVar15;
        (pRVar6->var_pop).mean = dVar15;
        (pRVar6->var_pop).dsquared = (dVar1 - dVar15) * dVar19 + (pRVar6->var_pop).dsquared;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (count != 0) {
    psVar4 = asel->sel_vector;
    psVar5 = bsel->sel_vector;
    psVar7 = ssel->sel_vector;
    uVar12 = 0;
    do {
      uVar13 = uVar12;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar12];
      }
      uVar8 = uVar12;
      if (psVar5 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar5[uVar12];
      }
      uVar14 = uVar12;
      if (psVar7 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar7[uVar12];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
         && ((puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))))
      {
        pRVar6 = states[uVar14];
        uVar18 = (pRVar6->var_pop).count + 1;
        pRVar6->count = pRVar6->count + 1;
        (pRVar6->var_pop).count = uVar18;
        dVar1 = bdata[uVar8];
        dVar15 = (pRVar6->var_pop).mean;
        dVar19 = dVar1 - dVar15;
        auVar17._8_4_ = (int)(uVar18 >> 0x20);
        auVar17._0_8_ = uVar18;
        auVar17._12_4_ = 0x45300000;
        dVar15 = dVar19 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) + dVar15;
        (pRVar6->var_pop).mean = dVar15;
        (pRVar6->var_pop).dsquared = (dVar1 - dVar15) * dVar19 + (pRVar6->var_pop).dsquared;
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}